

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O1

void __thiscall
t_php_generator::generate_deserialize_set_element
          (t_php_generator *this,ostream *out,t_set *tset,string *prefix)

{
  int iVar1;
  ostream *poVar2;
  t_type *ptVar3;
  string elem;
  t_field felem;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  t_field local_e0;
  
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"elem","");
  t_generator::tmp(&local_160,(t_generator *)this,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  ptVar3 = tset->elem_type_;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,local_160._M_dataplus._M_p,
             local_160._M_dataplus._M_p + local_160._M_string_length);
  t_field::t_field(&local_e0,ptVar3,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"$",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = null;",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
  generate_deserialize_field(this,out,&local_e0,&local_140,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  ptVar3 = t_type::get_true_type(tset->elem_type_);
  iVar1 = (*(ptVar3->super_t_doc)._vptr_t_doc[5])(ptVar3);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ptVar3->super_t_doc)._vptr_t_doc[10])(ptVar3);
    if ((char)iVar1 == '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"$",1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[] = $",6);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_160._M_dataplus._M_p,local_160._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";",1);
      goto LAB_00309e0b;
    }
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"$",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[$",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] = true;",9);
LAB_00309e0b:
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_field::~t_field(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_php_generator::generate_deserialize_set_element(ostream& out, t_set* tset, string prefix) {
  string elem = tmp("elem");
  t_field felem(tset->get_elem_type(), elem);

  indent(out) << "$" << elem << " = null;" << endl;

  generate_deserialize_field(out, &felem);

  t_type* elem_type = tset->get_elem_type();
  if(php_is_scalar(elem_type)) {
    indent(out) << "$" << prefix << "[$" << elem << "] = true;" << endl;
  } else {
    indent(out) << "$" << prefix << "[] = $" << elem << ";" << endl;
  }
}